

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O2

Byte * __thiscall
CharStringType2Interpreter::InterpretPut
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  pointer pCVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  anon_union_8_2_3d487603_for_CharStringOperand_1 aVar4;
  int iVar5;
  Trace *this_00;
  _List_node_base *p_Var6;
  CharStringOperand valueA;
  
  iVar5 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0x25])
                    (this->mImplementationHelper,this);
  if (iVar5 == 0) {
    if ((this->mOperandStack).
        super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl._M_node.
        _M_size < 2) {
      this_00 = Trace::DefaultTrace();
      inProgramCounter = (Byte *)0x0;
      Trace::TraceToLog(this_00,
                        "CharStringType2Interpreter::InterpretPut, put should have at least 2 arguments on stack. got %d. aborting"
                        ,(this->mOperandStack).
                         super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>.
                         _M_impl._M_node._M_size);
    }
    else {
      p_Var2 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var3 = p_Var2[1]._M_prev;
      p_Var6 = (_List_node_base *)(long)(double)p_Var3;
      if (((ulong)p_Var2[1]._M_next & 1) != 0) {
        p_Var6 = p_Var3;
      }
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      p_Var2 = (this->mOperandStack).
               super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               _M_node.super__List_node_base._M_prev;
      p_Var3 = p_Var2[1]._M_next;
      aVar4 = (anon_union_8_2_3d487603_for_CharStringOperand_1)p_Var2[1]._M_prev;
      std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::pop_back
                (&this->mOperandStack);
      pCVar1 = (this->mStorage).
               super__Vector_base<CharStringOperand,_std::allocator<CharStringOperand>_>._M_impl.
               super__Vector_impl_data._M_start + (long)p_Var6;
      *(_List_node_base **)pCVar1 = p_Var3;
      pCVar1->field_1 = aVar4;
    }
  }
  else {
    inProgramCounter = (Byte *)0x0;
  }
  return inProgramCounter;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretPut(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = mImplementationHelper->Type2Put(mOperandStack);
	if(status != eSuccess)
		return NULL;

	CharStringOperand valueA;
	CharStringOperand valueB;

	if(mOperandStack.size() < 2) {
		TRACE_LOG1("CharStringType2Interpreter::InterpretPut, put should have at least 2 arguments on stack. got %d. aborting", mOperandStack.size());
		return NULL;
	}

	valueB = mOperandStack.back();
	mOperandStack.pop_back();
	valueA = mOperandStack.back();
	mOperandStack.pop_back();

	mStorage[(valueB.IsInteger ? valueB.IntegerValue : (long)valueB.RealValue)] = valueA;

	return inProgramCounter;
}